

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<double>::Resize
          (RepeatedField<double> *this,int new_size,double *value)

{
  double *pdVar1;
  int in_ESI;
  int *in_RDI;
  int in_stack_0000008c;
  RepeatedField<double> *in_stack_00000090;
  double *in_stack_ffffffffffffff80;
  RepeatedField<double> *in_stack_ffffffffffffffe0;
  
  if (*in_RDI < in_ESI) {
    Reserve(in_stack_00000090,in_stack_0000008c);
    pdVar1 = elements(in_stack_ffffffffffffffe0);
    pdVar1 = pdVar1 + *in_RDI;
    elements(in_stack_ffffffffffffffe0);
    std::fill<double*,double>(in_stack_ffffffffffffff80,pdVar1,(double *)0x3f9802);
  }
  *in_RDI = in_ESI;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}